

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O0

bool absl::anon_unknown_0::ParseInfinityOrNan(char *begin,char *end,ParsedFloat *out)

{
  int iVar1;
  long in_RDX;
  char *in_RSI;
  undefined1 *in_RDI;
  char *nan_begin;
  bool local_31;
  char *local_28;
  bool local_1;
  
  if ((long)in_RSI - (long)in_RDI < 3) {
    local_1 = false;
  }
  else {
    switch(*in_RDI) {
    case 0x49:
    case 0x69:
      iVar1 = strings_internal::memcasecmp(in_RDI + 1,"nf",2);
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDX + 0x10) = 1;
        if (((long)in_RSI - (long)in_RDI < 8) ||
           (iVar1 = strings_internal::memcasecmp(in_RDI + 3,"inity",5), iVar1 != 0)) {
          *(undefined1 **)(in_RDX + 0x28) = in_RDI + 3;
        }
        else {
          *(undefined1 **)(in_RDX + 0x28) = in_RDI + 8;
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    default:
      local_1 = false;
      break;
    case 0x4e:
    case 0x6e:
      iVar1 = strings_internal::memcasecmp(in_RDI + 1,"an",2);
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDX + 0x10) = 2;
        *(undefined1 **)(in_RDX + 0x28) = in_RDI + 3;
        if ((in_RDI + 3 < in_RSI) && (in_RDI[3] == '(')) {
          local_28 = in_RDI + 4;
          while( true ) {
            local_31 = false;
            if (local_28 < in_RSI) {
              local_31 = IsNanChar(*local_28);
            }
            if (local_31 == false) break;
            local_28 = local_28 + 1;
          }
          if ((local_28 < in_RSI) && (*local_28 == ')')) {
            *(undefined1 **)(in_RDX + 0x18) = in_RDI + 4;
            *(char **)(in_RDX + 0x20) = local_28;
            *(char **)(in_RDX + 0x28) = local_28 + 1;
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool ParseInfinityOrNan(const char* begin, const char* end,
                        strings_internal::ParsedFloat* out) {
  if (end - begin < 3) {
    return false;
  }
  switch (*begin) {
    case 'i':
    case 'I': {
      // An infinity string consists of the characters "inf" or "infinity",
      // case insensitive.
      if (strings_internal::memcasecmp(begin + 1, "nf", 2) != 0) {
        return false;
      }
      out->type = strings_internal::FloatType::kInfinity;
      if (end - begin >= 8 &&
          strings_internal::memcasecmp(begin + 3, "inity", 5) == 0) {
        out->end = begin + 8;
      } else {
        out->end = begin + 3;
      }
      return true;
    }
    case 'n':
    case 'N': {
      // A NaN consists of the characters "nan", case insensitive, optionally
      // followed by a parenthesized sequence of zero or more alphanumeric
      // characters and/or underscores.
      if (strings_internal::memcasecmp(begin + 1, "an", 2) != 0) {
        return false;
      }
      out->type = strings_internal::FloatType::kNan;
      out->end = begin + 3;
      // NaN is allowed to be followed by a parenthesized string, consisting of
      // only the characters [a-zA-Z0-9_].  Match that if it's present.
      begin += 3;
      if (begin < end && *begin == '(') {
        const char* nan_begin = begin + 1;
        while (nan_begin < end && IsNanChar(*nan_begin)) {
          ++nan_begin;
        }
        if (nan_begin < end && *nan_begin == ')') {
          // We found an extra NaN specifier range
          out->subrange_begin = begin + 1;
          out->subrange_end = nan_begin;
          out->end = nan_begin + 1;
        }
      }
      return true;
    }
    default:
      return false;
  }
}